

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1a7362::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody
          (DebugCounterTest_RealProvidesReportAtExit_Test *this)

{
  AssertHelper AVar1;
  AssertHelper AVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *message;
  bool expect_output;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  DeathTest *gtest_dt;
  AssertHelper local_88;
  Message local_80 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_00541f11;
  ::(anonymous_namespace)::MatchOutput_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_60,(_anonymous_namespace_ *)0x1,expect_output);
  local_48.vtable_ = local_60.vtable_;
  local_48.buffer_ = local_60.buffer_;
  local_60.vtable_ = (VTable *)0x0;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018cdbe0;
  bVar4 = testing::internal::DeathTest::Create
                    ("{ static google::protobuf::internal::RealDebugCounter counter1(\"Foo.Bar\"); static google::protobuf::internal::RealDebugCounter counter2(\"Foo.Baz\"); static google::protobuf::internal::RealDebugCounter counter3(\"Num.32\"); static google::protobuf::internal::RealDebugCounter counter4(\"Num.128\"); counter1.Inc(); counter2.Inc(); counter2.Inc(); counter3.Inc(); counter3.Inc(); counter3.Inc(); counter4.Inc(); exit(0); }"
                     ,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                       *)&local_48,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                     ,0x39,(DeathTest **)&local_88);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_48);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_60);
  AVar1.data_ = local_88.data_;
  bVar3 = true;
  if (bVar4) {
    if (local_88.data_ != (AssertHelperData *)0x0) {
      iVar6 = (**(code **)(*(long *)local_88.data_ + 0x10))();
      AVar2.data_ = local_88.data_;
      if (iVar6 == 0) {
        testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)local_80,0);
        iVar6 = (**(code **)(*(long *)local_88.data_ + 0x18))();
        bVar3 = testing::ExitedWithCode::operator()((ExitedWithCode *)local_80,iVar6);
        cVar5 = (**(code **)(*(long *)AVar2.data_ + 0x20))(AVar2.data_,bVar3);
        if (cVar5 != '\0') goto LAB_00541ef8;
        bVar3 = true;
        bVar4 = false;
      }
      else {
        if (iVar6 == 1) {
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                 ::counter1 == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
              TestBody::counter1.counter_.super___atomic_base<unsigned_long>._M_i =
                   (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
              name._M_str = "Foo.Bar";
              name._M_len = 7;
              google::protobuf::internal::RealDebugCounter::Register(&TestBody::counter1,name);
              __cxa_guard_release();
            }
            if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                 ::counter2 == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
              TestBody::counter2.counter_.super___atomic_base<unsigned_long>._M_i =
                   (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
              name_00._M_str = "Foo.Baz";
              name_00._M_len = 7;
              google::protobuf::internal::RealDebugCounter::Register(&TestBody::counter2,name_00);
              __cxa_guard_release();
            }
            if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                 ::counter3 == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
              TestBody::counter3.counter_.super___atomic_base<unsigned_long>._M_i =
                   (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
              name_01._M_str = "Num.32";
              name_01._M_len = 6;
              google::protobuf::internal::RealDebugCounter::Register(&TestBody::counter3,name_01);
              __cxa_guard_release();
            }
            if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()
                 ::counter4 == '\0') && (iVar6 = __cxa_guard_acquire(), iVar6 != 0)) {
              TestBody::counter4.counter_.super___atomic_base<unsigned_long>._M_i =
                   (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
              name_02._M_str = "Num.128";
              name_02._M_len = 7;
              google::protobuf::internal::RealDebugCounter::Register(&TestBody::counter4,name_02);
              __cxa_guard_release();
            }
            TestBody::counter1.counter_.super___atomic_base<unsigned_long>._M_i =
                 (atomic<unsigned_long>)
                 ((long)TestBody::counter1.counter_.super___atomic_base<unsigned_long>._M_i + 1);
            TestBody::counter2.counter_.super___atomic_base<unsigned_long>._M_i =
                 (atomic<unsigned_long>)
                 ((long)TestBody::counter2.counter_.super___atomic_base<unsigned_long>._M_i + 2);
            TestBody::counter3.counter_.super___atomic_base<unsigned_long>._M_i =
                 (atomic<unsigned_long>)
                 ((long)TestBody::counter3.counter_.super___atomic_base<unsigned_long>._M_i + 3);
            TestBody::counter4.counter_.super___atomic_base<unsigned_long>._M_i =
                 (atomic<unsigned_long>)
                 ((long)TestBody::counter4.counter_.super___atomic_base<unsigned_long>._M_i + 1);
            exit(0);
          }
          (**(code **)(*(long *)local_88.data_ + 0x28))(local_88.data_,2);
          (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
        }
LAB_00541ef8:
        bVar3 = false;
        bVar4 = true;
      }
      (**(code **)(*(long *)AVar1.data_ + 8))(AVar1.data_);
      if (!bVar4) goto LAB_00541f0d;
    }
    bVar3 = false;
  }
LAB_00541f0d:
  if (!bVar3) {
    return;
  }
LAB_00541f11:
  testing::Message::Message(local_80);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x39,message);
  testing::internal::AssertHelper::operator=(&local_88,local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if (local_80[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_80[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

TEST(DebugCounterTest, RealProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter1("Foo.Bar");
        static google::protobuf::internal::RealDebugCounter counter2("Foo.Baz");
        static google::protobuf::internal::RealDebugCounter counter3("Num.32");
        static google::protobuf::internal::RealDebugCounter counter4("Num.128");
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        counter3.Inc();
        counter3.Inc();
        counter3.Inc();
        counter4.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(true));
}